

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

idx_t duckdb::QuantileOperation::FrameSize<duckdb::string_t>
                (QuantileIncluded<duckdb::string_t> *included,SubFrames *frames)

{
  bool bVar1;
  const_iterator this;
  reference idx;
  undefined8 in_RSI;
  idx_t i;
  FrameBounds *frame_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  SubFrames *__range3_1;
  FrameBounds *frame;
  const_iterator __end3;
  const_iterator __begin3;
  SubFrames *__range3;
  idx_t n;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *in_stack_ffffffffffffff98;
  QuantileIncluded<duckdb::string_t> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
  local_48;
  undefined8 local_40;
  reference local_38;
  FrameBounds *local_30;
  __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
  local_28;
  undefined8 local_20;
  idx_t local_18;
  undefined8 local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  bVar1 = QuantileIncluded<duckdb::string_t>::AllValid(in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_20 = local_10;
    local_28._M_current =
         (FrameBounds *)
         ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::begin
                   (in_stack_ffffffffffffff98);
    local_30 = (FrameBounds *)
               ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::end
                         (in_stack_ffffffffffffff98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                               *)in_stack_ffffffffffffff98), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                 ::operator*(&local_28);
      local_18 = (local_38->end - local_38->start) + local_18;
      __gnu_cxx::
      __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
      ::operator++(&local_28);
    }
  }
  else {
    local_40 = local_10;
    local_48._M_current =
         (FrameBounds *)
         ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::begin
                   (in_stack_ffffffffffffff98);
    this = ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::end
                     (in_stack_ffffffffffffff98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
                               *)in_stack_ffffffffffffff98), bVar1) {
      idx = __gnu_cxx::
            __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
            ::operator*(&local_48);
      for (in_stack_ffffffffffffffa0 = (QuantileIncluded<duckdb::string_t> *)idx->start;
          in_stack_ffffffffffffffa0 < (QuantileIncluded<duckdb::string_t> *)idx->end;
          in_stack_ffffffffffffffa0 =
               (QuantileIncluded<duckdb::string_t> *)((long)&in_stack_ffffffffffffffa0->fmask + 1))
      {
        bVar1 = QuantileIncluded<duckdb::string_t>::operator()
                          ((QuantileIncluded<duckdb::string_t> *)this._M_current,&idx->start);
        local_18 = bVar1 + local_18;
      }
      __gnu_cxx::
      __normal_iterator<const_duckdb::FrameBounds_*,_std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>_>
      ::operator++(&local_48);
    }
  }
  return local_18;
}

Assistant:

static idx_t FrameSize(QuantileIncluded<INPUT_TYPE> &included, const SubFrames &frames) {
		//	Count the number of valid values
		idx_t n = 0;
		if (included.AllValid()) {
			for (const auto &frame : frames) {
				n += frame.end - frame.start;
			}
		} else {
			//	NULLs or FILTERed values,
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					n += included(i);
				}
			}
		}

		return n;
	}